

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void sep_downsample(j_compress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_index,
                   JSAMPIMAGE output_buf,JDIMENSION out_row_group_index)

{
  long lVar1;
  long in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  JSAMPARRAY out_ptr;
  JSAMPARRAY in_ptr;
  jpeg_component_info *compptr;
  int ci;
  my_downsample_ptr downsample;
  undefined8 local_40;
  undefined4 local_34;
  
  lVar1 = *(long *)(in_RDI + 0x1e0);
  local_34 = 0;
  local_40 = *(long *)(in_RDI + 0x58);
  for (; local_34 < *(int *)(in_RDI + 0x4c); local_34 = local_34 + 1) {
    (**(code **)(lVar1 + 0x18 + (long)local_34 * 8))
              (in_RDI,local_40,*(long *)(in_RSI + (long)local_34 * 8) + (ulong)in_EDX * 8,
               *(long *)(in_RCX + (long)local_34 * 8) +
               (ulong)(uint)(in_R8D * *(int *)(local_40 + 0xc)) * 8);
    local_40 = local_40 + 0x60;
  }
  return;
}

Assistant:

METHODDEF(void)
sep_downsample(j_compress_ptr cinfo, JSAMPIMAGE input_buf,
               JDIMENSION in_row_index, JSAMPIMAGE output_buf,
               JDIMENSION out_row_group_index)
{
  my_downsample_ptr downsample = (my_downsample_ptr)cinfo->downsample;
  int ci;
  jpeg_component_info *compptr;
  JSAMPARRAY in_ptr, out_ptr;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    in_ptr = input_buf[ci] + in_row_index;
    out_ptr = output_buf[ci] + (out_row_group_index * compptr->v_samp_factor);
    (*downsample->methods[ci]) (cinfo, compptr, in_ptr, out_ptr);
  }
}